

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

result __thiscall
fmt::v6::internal::fixed_handler::on_digit
          (fixed_handler *this,char digit,uint64_t divisor,uint64_t remainder,uint64_t error,
          int param_6,bool integral)

{
  int iVar1;
  round_direction rVar2;
  ulong in_RCX;
  ulong in_RDX;
  long lVar3;
  undefined1 in_SIL;
  long *in_RDI;
  ulong in_R8;
  byte in_stack_00000008;
  int i;
  round_direction dir;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  int local_40;
  result local_4;
  
  if (in_RDX <= in_RCX) {
    assert_fail((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac,(char *)0x2432ac);
  }
  lVar3 = in_RDI[1];
  *(int *)(in_RDI + 1) = (int)lVar3 + 1;
  *(undefined1 *)(*in_RDI + (long)(int)lVar3) = in_SIL;
  if ((int)in_RDI[1] < *(int *)((long)in_RDI + 0xc)) {
    local_4 = more;
  }
  else {
    if ((in_stack_00000008 & 1) == 0) {
      if ((in_RDX <= in_R8) || (in_RDX - in_R8 <= in_R8)) {
        return error;
      }
    }
    else if ((in_R8 != 1) || (in_RDX < 3)) {
      assert_fail((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac,(char *)0x243340);
    }
    rVar2 = get_round_direction((uint64_t)in_RDI,
                                CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (rVar2 == up) {
      lVar3 = (long)((int)in_RDI[1] + -1);
      *(char *)(*in_RDI + lVar3) = *(char *)(*in_RDI + lVar3) + '\x01';
      iVar1 = (int)in_RDI[1];
      while( true ) {
        local_40 = iVar1 + -1;
        bVar4 = false;
        if (0 < local_40) {
          bVar4 = '9' < *(char *)(*in_RDI + (long)local_40);
        }
        if (!bVar4) break;
        *(undefined1 *)(*in_RDI + (long)local_40) = 0x30;
        *(char *)(*in_RDI + (long)(iVar1 + -2)) = *(char *)(*in_RDI + (long)(iVar1 + -2)) + '\x01';
        iVar1 = local_40;
      }
      if ('9' < *(char *)*in_RDI) {
        *(undefined1 *)*in_RDI = 0x31;
        lVar3 = in_RDI[1];
        *(int *)(in_RDI + 1) = (int)lVar3 + 1;
        *(undefined1 *)(*in_RDI + (long)(int)lVar3) = 0x30;
      }
      local_4 = done;
    }
    else {
      local_4 = error;
      if (rVar2 == down) {
        local_4 = done;
      }
    }
  }
  return local_4;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int, bool integral) {
    FMT_ASSERT(remainder < divisor, "");
    buf[size++] = digit;
    if (size < precision) return digits::more;
    if (!integral) {
      // Check if error * 2 < divisor with overflow prevention.
      // The check is not needed for the integral part because error = 1
      // and divisor > (1 << 32) there.
      if (error >= divisor || error >= divisor - error) return digits::error;
    } else {
      FMT_ASSERT(error == 1 && divisor > 2, "");
    }
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir != round_direction::up)
      return dir == round_direction::down ? digits::done : digits::error;
    ++buf[size - 1];
    for (int i = size - 1; i > 0 && buf[i] > '9'; --i) {
      buf[i] = '0';
      ++buf[i - 1];
    }
    if (buf[0] > '9') {
      buf[0] = '1';
      buf[size++] = '0';
    }
    return digits::done;
  }